

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DeleteColumnNames(sqlite3 *db,Table *pTable)

{
  ExprList *pList;
  int iVar1;
  Column *pCVar2;
  
  pCVar2 = pTable->aCol;
  if (pCVar2 != (Column *)0x0) {
    if (0 < pTable->nCol) {
      iVar1 = 0;
      do {
        if (pCVar2->zCnName != (char *)0x0) {
          sqlite3DbFreeNN(db,pCVar2->zCnName);
        }
        iVar1 = iVar1 + 1;
        pCVar2 = pCVar2 + 1;
      } while (iVar1 < pTable->nCol);
    }
    sqlite3DbNNFreeNN(db,pTable->aCol);
    if ((pTable->eTabType == '\0') && (pList = (pTable->u).tab.pDfltList, pList != (ExprList *)0x0))
    {
      exprListDeleteNN(db,pList);
    }
    if (db->pnBytesFreed == (int *)0x0) {
      pTable->aCol = (Column *)0x0;
      pTable->nCol = 0;
      if (pTable->eTabType == '\0') {
        (pTable->u).tab.pDfltList = (ExprList *)0x0;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteColumnNames(sqlite3 *db, Table *pTable){
  int i;
  Column *pCol;
  assert( pTable!=0 );
  assert( db!=0 );
  if( (pCol = pTable->aCol)!=0 ){
    for(i=0; i<pTable->nCol; i++, pCol++){
      assert( pCol->zCnName==0 || pCol->hName==sqlite3StrIHash(pCol->zCnName) );
      sqlite3DbFree(db, pCol->zCnName);
    }
    sqlite3DbNNFreeNN(db, pTable->aCol);
    if( IsOrdinaryTable(pTable) ){
      sqlite3ExprListDelete(db, pTable->u.tab.pDfltList);
    }
    if( db->pnBytesFreed==0 ){
      pTable->aCol = 0;
      pTable->nCol = 0;
      if( IsOrdinaryTable(pTable) ){
        pTable->u.tab.pDfltList = 0;
      }
    }
  }
}